

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::ParseTypeUseOpt(WastParser *this,FuncDeclaration *decl)

{
  bool bVar1;
  Result RVar2;
  
  bVar1 = MatchLpar(this,Type);
  if (bVar1) {
    decl->has_func_type = true;
    RVar2 = ParseVar(this,&decl->type_var);
    if (RVar2.enum_ == Error) {
      return (Result)Error;
    }
    RVar2 = Expect(this,Rpar);
    if (RVar2.enum_ == Error) {
      return (Result)Error;
    }
  }
  else {
    decl->has_func_type = false;
  }
  return (Result)Ok;
}

Assistant:

Result WastParser::ParseTypeUseOpt(FuncDeclaration* decl) {
  WABT_TRACE(ParseTypeUseOpt);
  if (MatchLpar(TokenType::Type)) {
    decl->has_func_type = true;
    CHECK_RESULT(ParseVar(&decl->type_var));
    EXPECT(Rpar);
  } else {
    decl->has_func_type = false;
  }
  return Result::Ok;
}